

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# end.c
# Opt level: O0

void disclose(int how,boolean taken)

{
  boolean ask_00;
  char cVar1;
  char *pcVar2;
  int iVar3;
  char local_98 [7];
  boolean ask;
  char qbuf [128];
  char local_f;
  char local_e;
  char local_d;
  int local_c;
  char defquery;
  char c;
  boolean taken_local;
  int how_local;
  
  local_e = '\0';
  local_d = taken;
  local_c = how;
  ask_00 = should_query_disclose_options(&local_f);
  if (invent != (obj *)0x0) {
    if (local_d == '\0') {
      strcpy(local_98,"Do you want your possessions identified?");
    }
    else {
      pcVar2 = "died";
      if (local_c == 0xe) {
        pcVar2 = "quit";
      }
      sprintf(local_98,"Do you want to see what you had when you %s?",pcVar2);
    }
    if (program_state.stopprint == 0) {
      cVar1 = local_f;
      if (ask_00 != '\0') {
        cVar1 = yn_function(local_98,"ynq",local_f);
      }
      local_e = cVar1;
      if (local_e == 'y') {
        display_inventory((char *)0x0,'\x01');
        container_contents(invent,'\x01','\x01');
      }
      if (local_e == 'q') {
        program_state.stopprint = program_state.stopprint + 1;
      }
    }
  }
  if (program_state.stopprint == 0) {
    cVar1 = local_f;
    if (ask_00 != '\0') {
      cVar1 = yn_function("Do you want to see your attributes?","ynq",local_f);
    }
    local_e = cVar1;
    if (local_e == 'y') {
      iVar3 = 2;
      if (0xb < local_c) {
        iVar3 = 1;
      }
      enlightenment(iVar3);
    }
    if (local_e == 'q') {
      program_state.stopprint = program_state.stopprint + 1;
    }
  }
  if (program_state.stopprint == 0) {
    list_vanquished(local_f,ask_00);
  }
  if (program_state.stopprint == 0) {
    list_genocided(local_f,ask_00);
  }
  if (program_state.stopprint == 0) {
    cVar1 = local_f;
    if (ask_00 != '\0') {
      cVar1 = yn_function("Do you want to see your conduct?","ynq",local_f);
    }
    local_e = cVar1;
    if (local_e == 'y') {
      iVar3 = 2;
      if (0xb < local_c) {
        iVar3 = 1;
      }
      show_conduct(iVar3);
    }
    if (local_e == 'q') {
      program_state.stopprint = program_state.stopprint + 1;
    }
  }
  return;
}

Assistant:

static void disclose(int how, boolean taken)
{
	char	c = 0, defquery;
	char	qbuf[QBUFSZ];
	boolean ask = should_query_disclose_options(&defquery);

	if (invent) {
	    if (taken)
		sprintf(qbuf,"Do you want to see what you had when you %s?",
			(how == QUIT) ? "quit" : "died");
	    else
		strcpy(qbuf,"Do you want your possessions identified?");

	    if (!done_stopprint) {
		c = ask ? yn_function(qbuf, ynqchars, defquery) : defquery;
		if (c == 'y') {
		    display_inventory(NULL, TRUE);
		    container_contents(invent, TRUE, TRUE);
		}
		if (c == 'q')  done_stopprint++;
	    }
	}

	if (!done_stopprint) {
	    c = ask ? yn_function("Do you want to see your attributes?",
				  ynqchars, defquery) : defquery;
	    if (c == 'y')
		enlightenment(how >= PANICKED ? 1 : 2); /* final */
	    if (c == 'q') done_stopprint++;
	}

	if (!done_stopprint)
	    list_vanquished(defquery, ask);

	if (!done_stopprint)
	    list_genocided(defquery, ask);

	if (!done_stopprint) {
	    c = ask ? yn_function("Do you want to see your conduct?",
				  ynqchars, defquery) : defquery;
	    if (c == 'y')
		show_conduct(how >= PANICKED ? 1 : 2);
	    if (c == 'q') done_stopprint++;
	}
}